

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ClearStatTables(Parse *pParse,int iDb,char *zType,char *zName)

{
  char *zDatabase;
  Table *pTVar1;
  uint uVar2;
  ulong uVar3;
  char zTab [24];
  char acStack_48 [24];
  
  zDatabase = pParse->db->aDb[iDb].zDbSName;
  uVar3 = 1;
  do {
    sqlite3_snprintf(0x18,acStack_48,"sqlite_stat%d",uVar3);
    pTVar1 = sqlite3FindTable(pParse->db,acStack_48,zDatabase);
    if (pTVar1 != (Table *)0x0) {
      sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",zDatabase,acStack_48,zType,zName);
    }
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 != 5);
  return;
}

Assistant:

static void sqlite3ClearStatTables(
  Parse *pParse,         /* The parsing context */
  int iDb,               /* The database number */
  const char *zType,     /* "idx" or "tbl" */
  const char *zName      /* Name of index or table */
){
  int i;
  const char *zDbName = pParse->db->aDb[iDb].zDbSName;
  for(i=1; i<=4; i++){
    char zTab[24];
    sqlite3_snprintf(sizeof(zTab),zTab,"sqlite_stat%d",i);
    if( sqlite3FindTable(pParse->db, zTab, zDbName) ){
      sqlite3NestedParse(pParse,
        "DELETE FROM %Q.%s WHERE %s=%Q",
        zDbName, zTab, zType, zName
      );
    }
  }
}